

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.c
# Opt level: O0

int convert_script_from_node
              (miniscript_node_t *top_node,uint32_t derive_child_num,uint32_t depth,uint32_t index,
              uchar *script,size_t script_len,size_t *write_len)

{
  uint local_5c;
  miniscript_node_t *pmStack_58;
  uint32_t count;
  miniscript_node_t *target_node;
  size_t output_len;
  char *buf;
  miniscript_node_t *pmStack_38;
  int ret;
  size_t script_len_local;
  uchar *script_local;
  uint32_t local_20;
  uint32_t index_local;
  uint32_t depth_local;
  uint32_t derive_child_num_local;
  miniscript_node_t *top_node_local;
  
  target_node = (miniscript_node_t *)0x0;
  pmStack_58 = top_node;
  for (local_5c = 0; local_5c < depth; local_5c = local_5c + 1) {
    if (pmStack_58->child == (miniscript_node_t *)0x0) {
      return -2;
    }
    pmStack_58 = pmStack_58->child;
  }
  local_5c = 0;
  while( true ) {
    if (index <= local_5c) {
      pmStack_38 = (miniscript_node_t *)script_len;
      script_len_local = (size_t)script;
      script_local._4_4_ = index;
      local_20 = depth;
      index_local = derive_child_num;
      _depth_local = top_node;
      output_len = (size_t)wally_malloc(1000000);
      if ((uchar *)output_len == (uchar *)0x0) {
        top_node_local._4_4_ = -3;
      }
      else {
        buf._4_4_ = generate_script_from_miniscript
                              (pmStack_58,(miniscript_node_t *)0x0,index_local,(uchar *)output_len,
                               1000000,(size_t *)&target_node);
        if (buf._4_4_ == 0) {
          *write_len = (size_t)target_node;
          if (target_node <= pmStack_38) {
            memcpy((void *)script_len_local,(void *)output_len,(size_t)target_node);
          }
        }
        else {
          *write_len = 0;
        }
        wally_bzero((void *)output_len,1000000);
        wally_free((void *)output_len);
        top_node_local._4_4_ = buf._4_4_;
      }
      return top_node_local._4_4_;
    }
    if (pmStack_58->next == (miniscript_node_t *)0x0) break;
    pmStack_58 = pmStack_58->next;
    local_5c = local_5c + 1;
  }
  return -2;
}

Assistant:

static int convert_script_from_node(
    struct miniscript_node_t *top_node,
    uint32_t derive_child_num,
    uint32_t depth,
    uint32_t index,
    unsigned char *script,
    size_t script_len,
    size_t *write_len)
{
    int ret;
    char *buf;
    size_t output_len = 0;
    struct miniscript_node_t *target_node = top_node;
    uint32_t count;

    for (count = 0; count < depth; ++count) {
        if (!target_node->child)
            return WALLY_EINVAL;
        target_node = target_node->child;
    }
    for (count = 0; count < index; ++count) {
        if (!target_node->next)
            return WALLY_EINVAL;
        target_node = target_node->next;
    }

    buf = wally_malloc(DESCRIPTOR_LIMIT_LENGTH);
    if (!buf)
        return WALLY_ENOMEM;

    ret = generate_script_from_miniscript(target_node,
                                          NULL,
                                          derive_child_num,
                                          (unsigned char *)buf,
                                          DESCRIPTOR_LIMIT_LENGTH,
                                          &output_len);
    if (ret == WALLY_OK) {
        *write_len = output_len;
        if (output_len > script_len) {
            /* return WALLY_OK, but data is not written. */
        } else {
            memcpy(script, buf, output_len);
        }
    } else {
        *write_len = 0;
    }

    wally_bzero(buf, DESCRIPTOR_LIMIT_LENGTH);
    wally_free(buf);
    return ret;
}